

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O1

BCReg cur_topslot(GCproto *pt,BCIns *pc,uint32_t nres)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = pc[-1];
  if ((char)uVar1 == '2') {
    uVar1 = pc[(ulong)(uVar1 >> 0x10) - 0x8000];
  }
  uVar2 = (uVar1 & 0xff) - 0x3f;
  uVar2 = uVar2 >> 1 | (uint)((uVar2 & 1) != 0) << 0x1f;
  if (uVar2 - 1 < 2) {
    return (uVar1 >> 0x10 & 0xff) + nres + (uVar1 >> 8 & 0xff);
  }
  if (uVar2 == 0) {
    return ((uVar1 >> 8 & 0xff) + nres) - 1;
  }
  if (uVar2 == 5) {
    return ((uVar1 >> 8 & 0xff) + nres + (uVar1 >> 0x10)) - 1;
  }
  return (BCReg)pt->framesize;
}

Assistant:

static BCReg cur_topslot(GCproto *pt, const BCIns *pc, uint32_t nres)
{
  BCIns ins = pc[-1];
  if (bc_op(ins) == BC_UCLO)
    ins = pc[bc_j(ins)];
  switch (bc_op(ins)) {
  case BC_CALLM: case BC_CALLMT: return bc_a(ins) + bc_c(ins) + nres-1+1+LJ_FR2;
  case BC_RETM: return bc_a(ins) + bc_d(ins) + nres-1;
  case BC_TSETM: return bc_a(ins) + nres-1;
  default: return pt->framesize;
  }
}